

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O1

void Rsb_DecPrintTable(word *pCexes,int nGs,int nGsAll,Vec_Int_t *vTries)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int pCands [16];
  ulong local_a0;
  int local_78 [18];
  
  if (vTries->nSize == 0) {
    return;
  }
  iVar5 = 4;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("  ");
  uVar6 = 0;
  if (0 < nGs) {
    uVar2 = 0;
    iVar5 = nGs;
    do {
      printf("%d",(ulong)(uint)((int)uVar2 + (int)(uVar2 / 100) * -100) * 0x1999999a >> 0x20);
      uVar2 = (ulong)((int)uVar2 + 1);
      iVar5 = iVar5 + -1;
      uVar6 = nGs;
    } while (iVar5 != 0);
  }
  putchar(0x7c);
  iVar5 = nGsAll - uVar6;
  if (iVar5 != 0 && (int)uVar6 <= nGsAll) {
    do {
      printf("%d",(ulong)(uVar6 % 100) / 10);
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  putchar(10);
  iVar5 = 4;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("  ");
  uVar6 = 0;
  if (0 < nGs) {
    uVar2 = 0;
    iVar5 = nGs;
    do {
      printf("%d",(ulong)(uint)((int)uVar2 + (int)(uVar2 / 10) * -10));
      uVar2 = (ulong)((int)uVar2 + 1);
      iVar5 = iVar5 + -1;
      uVar6 = nGs;
    } while (iVar5 != 0);
  }
  putchar(0x7c);
  iVar5 = nGsAll - uVar6;
  if (iVar5 != 0 && (int)uVar6 <= nGsAll) {
    do {
      printf("%d",(ulong)(uVar6 % 10));
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  putchar(10);
  putchar(10);
  iVar5 = vTries->nSize;
  uVar1 = (ulong)(uint)nGs;
  uVar2 = (ulong)(uint)nGsAll;
  if (0 < iVar5) {
    local_a0 = 0;
    uVar9 = 0;
    do {
      local_78[0] = -1;
      local_78[1] = 0xffffffff;
      local_78[2] = 0xffffffff;
      local_78[3] = 0xffffffff;
      iVar8 = (int)uVar9;
      if (iVar5 - iVar8 == 0 || iVar5 < iVar8) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0;
        uVar4 = uVar9;
        do {
          if (iVar8 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (vTries->pArray[uVar4] == -1) {
            uVar9 = (ulong)((int)uVar4 + 1);
            break;
          }
          local_78[uVar3] = vTries->pArray[uVar4];
          uVar3 = uVar3 + 1;
          uVar4 = uVar4 + 1;
        } while ((uint)(iVar5 - iVar8) != uVar3);
      }
      if (4 < (uint)uVar3) {
        __assert_fail("nCands <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                      ,0xef,"void Rsb_DecPrintTable(word *, int, int, Vec_Int_t *)");
      }
      lVar7 = 0;
      do {
        if (local_78[lVar7] < 0) {
          printf("    ");
        }
        else {
          printf("%4d");
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      uVar3 = 0;
      printf("  ");
      if (0 < nGs) {
        uVar3 = 0;
        do {
          putchar((uint)((pCexes[(local_a0 >> 6) + uVar3] & 1L << ((byte)local_a0 & 0x3f)) != 0) * 3
                  + 0x2b);
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      putchar(0x7c);
      if ((int)uVar3 < nGsAll) {
        uVar3 = uVar3 & 0xffffffff;
        do {
          putchar((uint)((pCexes[(local_a0 >> 6) + uVar3] & 1L << ((byte)local_a0 & 0x3f)) != 0) * 3
                  + 0x2b);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      printf("  %3d\n",local_a0 & 0xffffffff);
      local_a0 = local_a0 + 1;
      iVar5 = vTries->nSize;
    } while ((int)uVar9 < iVar5);
  }
  putchar(10);
  iVar5 = 4;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  uVar9 = 0;
  printf("  ");
  if (0 < nGs) {
    uVar9 = 0;
    do {
      uVar3 = pCexes[uVar9] - (pCexes[uVar9] >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
      uVar3 = (uVar3 >> 8) + uVar3;
      lVar7 = (uVar3 >> 0x10) + uVar3;
      printf("%d",(ulong)((int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xfe) / 10);
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  putchar(0x7c);
  if ((int)uVar9 < nGsAll) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      uVar3 = pCexes[uVar9] - (pCexes[uVar9] >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
      uVar3 = (uVar3 >> 8) + uVar3;
      lVar7 = (uVar3 >> 0x10) + uVar3;
      printf("%d",(ulong)((int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xfe) / 10);
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  putchar(10);
  iVar5 = 4;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  uVar9 = 0;
  printf("  ");
  if (0 < nGs) {
    uVar9 = 0;
    do {
      uVar3 = pCexes[uVar9] - (pCexes[uVar9] >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
      uVar3 = (uVar3 >> 8) + uVar3;
      lVar7 = (uVar3 >> 0x10) + uVar3;
      printf("%d",(ulong)(((int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xffU) % 10));
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  putchar(0x7c);
  if ((int)uVar9 < nGsAll) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      uVar1 = pCexes[uVar9] - (pCexes[uVar9] >> 1 & 0x5555555555555555);
      uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
      uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
      uVar1 = (uVar1 >> 8) + uVar1;
      lVar7 = (uVar1 >> 0x10) + uVar1;
      printf("%d",(ulong)(((int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xffU) % 10));
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  putchar(10);
  putchar(10);
  return;
}

Assistant:

void Rsb_DecPrintTable( word * pCexes, int nGs, int nGsAll, Vec_Int_t * vTries ) 
{
    int pCands[16], nCands;
    int i, c, Cand, iStart = 0;
    if ( Vec_IntSize(vTries) == 0 )
        return;

//    printf( "\n" );
    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", (i % 100) / 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", (i % 100) / 10 );
    printf( "\n" );

    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", i % 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", i % 10 );
    printf( "\n" );
    printf( "\n" );

    for ( c = 0; iStart < Vec_IntSize(vTries); c++ )
    {
        // collect candidates
        for ( i = 0; i < 4; i++ )
            pCands[i] = -1;
        nCands = 0;
        Vec_IntForEachEntryStart( vTries, Cand, i, iStart )
            if ( Cand == -1 )
            {
                iStart = i + 1;
                break;
            }
            else
                pCands[nCands++] = Cand;
        assert( nCands <= 4 );
        // print them
        for ( i = 0; i < 4; i++ )
            if ( pCands[i] >= 0 )
                printf( "%4d", pCands[i] );
            else
                printf( "    " );
        // print the bit-string
        printf( "  " );
        for ( i = 0; i < nGs; i++ )
            printf( "%c", Abc_TtGetBit( pCexes + i, c ) ? '.' : '+' );
        printf( "|" );
        for ( ; i < nGsAll; i++ )
            printf( "%c", Abc_TtGetBit( pCexes + i, c ) ? '.' : '+' );
        printf( "  %3d\n", c );
    }
    printf( "\n" );

    // write the number of ones
    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) / 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) / 10 );
    printf( "\n" );

    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) % 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) % 10 );
    printf( "\n" );
    printf( "\n" );
}